

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_simd.cpp
# Opt level: O2

void multikey_simd<unsigned_short>(uchar **strings,size_t N,size_t depth)

{
  uchar *puVar1;
  size_t sVar2;
  unsigned_long N_00;
  unsigned_short pivot;
  uint16_t uVar3;
  int iVar4;
  size_t i;
  size_t sVar5;
  void *__src;
  uint8_t *oracle;
  ulong n;
  array<unsigned_long,_3UL> bucketsize;
  size_t bucketindex [3];
  
  if (N < 0x20) {
    insertion_sort(strings,(int)N,depth);
    return;
  }
  pivot = pseudo_median<unsigned_short>(strings,N,depth);
  iVar4 = posix_memalign((void **)&bucketsize,0x10,N);
  oracle = (uint8_t *)bucketsize._M_elems[0];
  if (iVar4 != 0) {
    oracle = (uint8_t *)0x0;
  }
  bucketindex[0] = 0;
  std::array<unsigned_long,_3UL>::fill(&bucketsize,bucketindex);
  n = N & 0xfffffffffffffff0;
  calculate_bucketsizes_sse<false>(strings,n,oracle,pivot,depth);
  for (; n < N; n = n + 1) {
    uVar3 = get_char<unsigned_short>(strings[n],depth);
    oracle[n] = (pivot <= uVar3 && uVar3 != pivot) * '\x02' | uVar3 == pivot;
  }
  for (sVar5 = 0; N_00 = bucketsize._M_elems[0], N != sVar5; sVar5 = sVar5 + 1) {
    bucketsize._M_elems[oracle[sVar5]] = bucketsize._M_elems[oracle[sVar5]] + 1;
  }
  sVar5 = bucketsize._M_elems[1] + bucketsize._M_elems[0];
  if (bucketsize._M_elems[2] + sVar5 != N) {
    __assert_fail("bucketsize[0] + bucketsize[1] + bucketsize[2] == N",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_simd.cpp"
                  ,0x127,
                  "void multikey_simd(unsigned char **, size_t, size_t) [CharT = unsigned short]");
  }
  __src = malloc(N * 8);
  bucketindex[0] = 0;
  bucketindex[1] = N_00;
  bucketindex[2] = sVar5;
  for (sVar5 = 0; N != sVar5; sVar5 = sVar5 + 1) {
    puVar1 = strings[sVar5];
    sVar2 = bucketindex[oracle[sVar5]];
    bucketindex[oracle[sVar5]] = sVar2 + 1;
    *(uchar **)((long)__src + sVar2 * 8) = puVar1;
  }
  memcpy(strings,__src,N * 8);
  free(__src);
  free(oracle);
  multikey_simd<unsigned_short>(strings,N_00,depth);
  if ((char)pivot != '\0') {
    multikey_simd<unsigned_short>(strings + bucketsize._M_elems[0],bucketsize._M_elems[1],depth + 2)
    ;
  }
  multikey_simd<unsigned_short>
            (strings + bucketsize._M_elems[0] + bucketsize._M_elems[1],bucketsize._M_elems[2],depth)
  ;
  return;
}

Assistant:

static void
multikey_simd(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 32) {
		insertion_sort(strings, N, depth);
		return;
	}
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	uint8_t* const restrict oracle =
		static_cast<uint8_t*>(_mm_malloc(N, 16));
	std::array<size_t, 3> bucketsize;
	bucketsize.fill(0);
	size_t i=N-N%16;
	calculate_bucketsizes_sse<false>(strings, i, oracle, partval, depth);
	for (; i < N; ++i)
		oracle[i] = get_bucket(
				get_char<CharT>(strings[i], depth),
				partval);
	for (i=0; i < N; ++i)
		++bucketsize[oracle[i]];
	assert(bucketsize[0] + bucketsize[1] + bucketsize[2] == N);
	unsigned char** sorted =
		static_cast<unsigned char**>(malloc(N*sizeof(unsigned char*)));
	size_t bucketindex[3];
	bucketindex[0] = 0;
	bucketindex[1] = bucketsize[0];
	bucketindex[2] = bucketsize[0] + bucketsize[1];
	for (size_t i=0; i < N; ++i) {
		sorted[bucketindex[oracle[i]]++] = strings[i];
	}
	std::copy(sorted, sorted+N, strings);
	free(sorted);
	_mm_free(oracle);
	multikey_simd<CharT>(strings, bucketsize[0], depth);
	if (not is_end(partval))
		multikey_simd<CharT>(strings+bucketsize[0],
				bucketsize[1], depth+sizeof(CharT));
	multikey_simd<CharT>(strings+bucketsize[0]+bucketsize[1],
			bucketsize[2], depth);
}